

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

_Bool av1_cnn_predict_img_multi_out
                (uint8_t **dgd,int width,int height,int stride,CNN_CONFIG *cnn_config,
                CNN_THREAD_DATA *thread_data,CNN_MULTI_OUT *output)

{
  long lVar1;
  float *pfVar2;
  size_t __n;
  uint uVar3;
  _Bool _Var4;
  int iVar5;
  void *memblk;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int j;
  int iVar19;
  ulong uVar20;
  float *pfVar21;
  int j_1;
  int in_height;
  ulong uVar22;
  int iVar23;
  float *pfVar24;
  int in_width;
  int iVar25;
  int iVar26;
  bool bVar27;
  float *inputs [256];
  float *local_838 [257];
  
  lVar6 = (long)width;
  lVar1 = lVar6 + (long)cnn_config->ext_width * 2;
  uVar3 = cnn_config->layer_config[0].in_channels;
  in_height = height + cnn_config->ext_height * 2;
  in_width = (int)lVar1;
  iVar5 = in_height * in_width;
  memblk = aom_malloc((long)(int)(iVar5 * uVar3) << 2);
  _Var4 = false;
  if (memblk != (void *)0x0) {
    __n = lVar1 * 4;
    uVar12 = 0;
    if (0 < width) {
      uVar12 = (ulong)(uint)width;
    }
    uVar9 = 0;
    if (0 < height) {
      uVar9 = (ulong)(uint)height;
    }
    lVar10 = (long)stride;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    iVar8 = 0;
    for (uVar22 = 0; uVar22 != uVar3; uVar22 = uVar22 + 1) {
      lVar7 = (long)iVar8 * 4;
      pfVar2 = (float *)((long)memblk + (long)(iVar5 * (int)uVar22) * 4);
      local_838[uVar22] = pfVar2;
      iVar23 = cnn_config->ext_height;
      lVar11 = (long)(iVar23 * in_width);
      iVar25 = cnn_config->ext_width;
      lVar13 = (long)iVar25;
      if (cnn_config->strict_bounds == 0) {
        iVar19 = -iVar23;
        iVar15 = -iVar25;
        lVar16 = (long)iVar15;
        iVar26 = width + iVar25;
        if (width + iVar25 < iVar15) {
          iVar26 = iVar15;
        }
        lVar17 = (long)iVar19;
        iVar25 = iVar23 + height;
        if (iVar23 + height < iVar19) {
          iVar25 = iVar19;
        }
        lVar7 = __n * lVar17 + lVar13 * 4 + lVar7 + lVar11 * 4 + lVar16 * 4 + (long)memblk;
        lVar11 = lVar10 * lVar17 + lVar16;
        for (; lVar17 != iVar25; lVar17 = lVar17 + 1) {
          for (lVar13 = 0; iVar26 - lVar16 != lVar13; lVar13 = lVar13 + 1) {
            *(float *)(lVar7 + lVar13 * 4) = (float)dgd[uVar22][lVar13 + lVar11] / 255.0;
          }
          lVar7 = lVar7 + __n;
          lVar11 = lVar11 + lVar10;
        }
      }
      else {
        lVar16 = lVar7 + lVar13 * 4 + lVar11 * 4 + (long)memblk;
        lVar17 = 0;
        for (uVar18 = 0; uVar18 != uVar9; uVar18 = uVar18 + 1) {
          for (uVar20 = 0; uVar12 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)(lVar16 + uVar20 * 4) = (float)dgd[uVar22][uVar20 + lVar17] / 255.0;
          }
          lVar16 = lVar16 + __n;
          lVar17 = lVar17 + lVar10;
        }
        uVar14 = -iVar25;
        uVar18 = 0;
        if (iVar25 < 0) {
          uVar18 = (ulong)uVar14;
        }
        lVar16 = lVar13 * 4 + lVar7 + lVar11 * 4;
        lVar7 = (long)(int)uVar14 * 4 + lVar16 + (long)memblk;
        pfVar24 = (float *)((long)memblk + lVar16 + lVar6 * 4);
        for (uVar20 = 0; uVar20 != uVar9; uVar20 = uVar20 + 1) {
          for (lVar16 = 0; pfVar21 = pfVar24, lVar17 = lVar6, uVar18 - (long)(int)uVar14 != lVar16;
              lVar16 = lVar16 + 1) {
            *(float *)(lVar7 + lVar16 * 4) = pfVar2[lVar11 + lVar13 + uVar20 * lVar1];
          }
          for (; lVar17 < width + iVar25; lVar17 = lVar17 + 1) {
            *pfVar21 = pfVar2[lVar11 + lVar13 + lVar6 + uVar20 * lVar1 + -1];
            pfVar21 = pfVar21 + 1;
          }
          lVar7 = lVar7 + __n;
          pfVar24 = pfVar24 + lVar1;
        }
        iVar25 = -iVar23;
        if (-1 < iVar23) {
          iVar25 = 0;
        }
        iVar25 = iVar25 + iVar23;
        iVar23 = iVar23 * -in_width;
        while (bVar27 = iVar25 != 0, iVar25 = iVar25 + -1, iVar26 = height * in_width,
              iVar15 = height, bVar27) {
          memcpy(pfVar2 + lVar11 + lVar13 + (iVar23 - cnn_config->ext_width),
                 pfVar2 + lVar11 + (lVar13 - cnn_config->ext_width),__n);
          iVar23 = iVar23 + in_width;
        }
        for (; iVar15 < cnn_config->ext_height + height; iVar15 = iVar15 + 1) {
          memcpy(pfVar2 + lVar11 + lVar13 + (iVar26 - cnn_config->ext_width),
                 pfVar2 + lVar11 + lVar13 + ((height + -1) * in_width - cnn_config->ext_width),__n);
          iVar26 = iVar26 + in_width;
        }
      }
      iVar8 = iVar8 + iVar5;
    }
    _Var4 = av1_cnn_predict_c(local_838,in_width,in_height,in_width,cnn_config,thread_data,output);
    aom_free(memblk);
  }
  return _Var4;
}

Assistant:

bool av1_cnn_predict_img_multi_out(uint8_t **dgd, int width, int height,
                                   int stride, const CNN_CONFIG *cnn_config,
                                   const CNN_THREAD_DATA *thread_data,
                                   CNN_MULTI_OUT *output) {
  const float max_val = 255.0;

  const int in_width = width + 2 * cnn_config->ext_width;
  const int in_height = height + 2 * cnn_config->ext_height;
  const int in_channels = cnn_config->layer_config[0].in_channels;
  float *inputs[CNN_MAX_CHANNELS];
  float *input_ =
      (float *)aom_malloc(in_width * in_height * in_channels * sizeof(*input_));
  if (!input_) return false;
  const int in_stride = in_width;

  for (int c = 0; c < in_channels; ++c) {
    inputs[c] = input_ + c * in_stride * in_height;
    float *input =
        inputs[c] + cnn_config->ext_height * in_stride + cnn_config->ext_width;

    if (cnn_config->strict_bounds) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
      // extend left and right
      for (int i = 0; i < height; ++i) {
        for (int j = -cnn_config->ext_width; j < 0; ++j)
          input[i * in_stride + j] = input[i * in_stride];
        for (int j = width; j < width + cnn_config->ext_width; ++j)
          input[i * in_stride + j] = input[i * in_stride + width - 1];
      }
      // extend top and bottom
      for (int i = -cnn_config->ext_height; i < 0; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[-cnn_config->ext_width], in_width * sizeof(*input));
      for (int i = height; i < height + cnn_config->ext_height; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[(height - 1) * in_stride - cnn_config->ext_width],
               in_width * sizeof(*input));
    } else {
      for (int i = -cnn_config->ext_height; i < height + cnn_config->ext_height;
           ++i)
        for (int j = -cnn_config->ext_width; j < width + cnn_config->ext_width;
             ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
    }
  }
  bool success = av1_cnn_predict((const float **)inputs, in_width, in_height,
                                 in_stride, cnn_config, thread_data, output);

  aom_free(input_);
  return success;
}